

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error storeAttributeValue(XML_Parser parser,ENCODING *enc,int isCdata,char *ptr,char *end,
                             STRING_POOL *pool)

{
  XML_Char *pXVar1;
  int iVar2;
  XML_Error result;
  STRING_POOL *pool_local;
  char *end_local;
  char *ptr_local;
  int isCdata_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  parser_local._4_4_ = appendAttributeValue(parser,enc,isCdata,ptr,end,pool);
  if (parser_local._4_4_ == XML_ERROR_NONE) {
    if (((isCdata == 0) && (pool->ptr != pool->start)) && (pool->ptr[-1] == ' ')) {
      pool->ptr = pool->ptr + -1;
    }
    if ((pool->ptr == pool->end) && (iVar2 = poolGrow(pool), iVar2 == 0)) {
      parser_local._4_4_ = XML_ERROR_NO_MEMORY;
    }
    else {
      pXVar1 = pool->ptr;
      pool->ptr = pXVar1 + 1;
      *pXVar1 = '\0';
      parser_local._4_4_ = XML_ERROR_NONE;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error
storeAttributeValue(XML_Parser parser, const ENCODING *enc, int isCdata,
                    const char *ptr, const char *end,
                    STRING_POOL *pool)
{
  enum XML_Error result = appendAttributeValue(parser, enc, isCdata, ptr, end, pool);
  if (result)
    return result;
  if (!isCdata && poolLength(pool) && poolLastChar(pool) == 0x20)
    poolChop(pool);
  if (!poolAppendChar(pool, XML_T('\0')))
    return XML_ERROR_NO_MEMORY;
  return XML_ERROR_NONE;
}